

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::toString(Catch *this,wstring *value)

{
  ulong uVar1;
  int *piVar2;
  undefined4 *puVar3;
  char local_71;
  ulong local_50;
  size_t i;
  string local_38 [8];
  string s;
  wstring *value_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::wstring::size();
  std::__cxx11::string::reserve((ulong)local_38);
  local_50 = 0;
  while( true ) {
    uVar1 = std::__cxx11::wstring::size();
    if (uVar1 <= local_50) break;
    piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)value);
    if (*piVar2 < 0x100) {
      puVar3 = (undefined4 *)std::__cxx11::wstring::operator[]((ulong)value);
      local_71 = (char)*puVar3;
    }
    else {
      local_71 = '?';
    }
    std::__cxx11::string::operator+=(local_38,local_71);
    local_50 = local_50 + 1;
  }
  toString(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string toString( std::wstring const& value ) {

    std::string s;
    s.reserve( value.size() );
    for(size_t i = 0; i < value.size(); ++i )
        s += value[i] <= 0xff ? static_cast<char>( value[i] ) : '?';
    return Catch::toString( s );
}